

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O1

string * __thiscall
crsGA::LogHandler::buildOutpuMessage
          (string *__return_storage_ptr__,LogHandler *this,
          time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
          *when,LogLevel level,string *str)

{
  ostream *poVar1;
  char *pcVar2;
  ostringstream msg;
  string local_1b8;
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  switch(level) {
  case LOG_FATAL:
    pcVar2 = "[";
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"[",1);
    toDateTime_abi_cxx11_(&local_1b8,(LogHandler *)pcVar2,when);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_198,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"] <FATAL>:",10);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,(str->_M_dataplus)._M_p,str->_M_string_length);
    break;
  case LOG_WARNING:
    pcVar2 = "[";
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"[",1);
    toDateTime_abi_cxx11_(&local_1b8,(LogHandler *)pcVar2,when);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_198,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"] <WARNING>: ",0xd);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,(str->_M_dataplus)._M_p,str->_M_string_length);
    break;
  case LOG_NOTICE:
    pcVar2 = "[";
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"[",1);
    toDateTime_abi_cxx11_(&local_1b8,(LogHandler *)pcVar2,when);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_198,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"] <NOTICE>:  ",0xd);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,(str->_M_dataplus)._M_p,str->_M_string_length);
    break;
  case LOG_DEBUG:
    pcVar2 = "[";
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"[",1);
    toDateTime_abi_cxx11_(&local_1b8,(LogHandler *)pcVar2,when);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_198,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"] <DEBUG>:   ",0xd);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,(str->_M_dataplus)._M_p,str->_M_string_length);
    break;
  case LOG_VERBOSE:
    pcVar2 = "[";
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"[",1);
    toDateTime_abi_cxx11_(&local_1b8,(LogHandler *)pcVar2,when);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_198,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"] <VERBOSE>: ",0xd);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,(str->_M_dataplus)._M_p,str->_M_string_length);
    break;
  default:
    goto switchD_00109eb9_default;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
switchD_00109eb9_default:
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

std::string LogHandler::buildOutpuMessage(const std::chrono::time_point<std::chrono::system_clock>& when, LogLevel level, const std::string& str)
{
    std::ostringstream msg;
    switch (level)
    {
    case LOG_FATAL:
        msg << "[" << toDateTime(when) << "] <FATAL>:" << str;
        break;
    case LOG_WARNING:
        msg << "[" << toDateTime(when) << "] <WARNING>: " << str;
        break;
    case LOG_NOTICE:
        msg << "[" << toDateTime(when) << "] <NOTICE>:  " << str;
        break;
    case LOG_DEBUG:
        msg << "[" << toDateTime(when) << "] <DEBUG>:   " << str;
        break;
    case LOG_VERBOSE:
        msg << "[" << toDateTime(when) << "] <VERBOSE>: " << str;
        break;
    default:
        break;
    }
    return msg.str();
}